

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::makeSharedVerticeDistinct
               (VertexPacket **packet,
               set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>
               *vertices,VertexPacketAllocator *vpalloc)

{
  VertexPacket *pVVar1;
  undefined8 uVar2;
  iterator iVar3;
  VertexPacket *pVVar4;
  long lVar5;
  ulong uVar6;
  
  iVar3 = std::
          _Rb_tree<rr::VertexPacket_*,_rr::VertexPacket_*,_std::_Identity<rr::VertexPacket_*>,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>
          ::find(&vertices->_M_t,packet);
  if ((_Rb_tree_header *)iVar3._M_node != &(vertices->_M_t)._M_impl.super__Rb_tree_header) {
    pVVar4 = VertexPacketAllocator::alloc(vpalloc);
    uVar2 = *(undefined8 *)(((*packet)->position).m_data + 2);
    *(undefined8 *)(pVVar4->position).m_data = *(undefined8 *)((*packet)->position).m_data;
    *(undefined8 *)((pVVar4->position).m_data + 2) = uVar2;
    pVVar1 = *packet;
    pVVar4->pointSize = pVVar1->pointSize;
    pVVar4->primitiveID = pVVar1->primitiveID;
    lVar5 = 0x2c;
    for (uVar6 = 0; uVar6 < vpalloc->m_numberOfVertexOutputs; uVar6 = uVar6 + 1) {
      pVVar1 = *packet;
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar5 + -0x14) =
           *(undefined4 *)((long)(pVVar1->position).m_data + lVar5 + -0x14);
      *(undefined4 *)((long)(&pVVar4->position + -1) + lVar5) =
           *(undefined4 *)((long)(&pVVar1->position + -1) + lVar5);
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar5 + -0xc) =
           *(undefined4 *)((long)(pVVar1->position).m_data + lVar5 + -0xc);
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar5 + -8) =
           *(undefined4 *)((long)(pVVar1->position).m_data + lVar5 + -8);
      lVar5 = lVar5 + 0x10;
    }
    *packet = pVVar4;
    return;
  }
  std::
  _Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
  ::_M_insert_unique<rr::VertexPacket*const&>
            ((_Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
              *)vertices,packet);
  return;
}

Assistant:

void makeSharedVerticeDistinct (VertexPacket*& packet, std::set<VertexPacket*, std::less<void*> >& vertices, VertexPacketAllocator& vpalloc)
{
	// distinct
	if (vertices.find(packet) == vertices.end())
	{
		vertices.insert(packet);
	}
	else
	{
		VertexPacket* newPacket = vpalloc.alloc();

		// copy packet output values
		newPacket->position		= packet->position;
		newPacket->pointSize	= packet->pointSize;
		newPacket->primitiveID	= packet->primitiveID;

		for (size_t outputNdx = 0; outputNdx < vpalloc.getNumVertexOutputs(); ++outputNdx)
			newPacket->outputs[outputNdx] = packet->outputs[outputNdx];

		// no need to insert new packet to "vertices" as newPacket is unique
		packet = newPacket;
	}
}